

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,string *filename,int N)

{
  string *__rhs;
  char cVar1;
  int *piVar2;
  long lVar3;
  int *__dest;
  invalid_argument *this_00;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ofstream fil;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_00108ce8;
  __rhs = &this->filename_;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(__rhs->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_270,"Error! Cannot open file ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_250 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_250 == plVar5) {
      local_240 = *plVar5;
      lStack_238 = plVar4[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar5;
    }
    local_248 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::invalid_argument::invalid_argument(this_00,(string *)&local_250);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::close();
  uVar11 = (ulong)(uint)-N;
  if (0 < N) {
    uVar11 = (ulong)(uint)N;
  }
  this->znak = N >> 0x1f | 1;
  uVar6 = 1;
  uVar9 = 0;
  uVar8 = 0xffffffffffffffff;
  do {
    uVar12 = uVar8;
    uVar6 = uVar6 * 10;
    uVar8 = uVar12 + 1;
    uVar9 = uVar9 + 4;
  } while (uVar6 <= (uint)uVar11);
  uVar6 = (int)uVar12 + 2;
  this->L = uVar6;
  piVar2 = (int *)operator_new__(uVar9);
  lVar3 = uVar12 + 3;
  this->vector_ = piVar2;
  do {
    piVar2[(int)lVar3 - 2] = (int)uVar11 + (int)(uVar11 / 10) * -10;
    lVar3 = lVar3 + -1;
    uVar11 = uVar11 / 10;
  } while (1 < lVar3);
  if (1 < uVar6) {
    uVar12 = 0;
    uVar11 = uVar8;
    do {
      if (0 < piVar2[uVar12]) goto LAB_001051f3;
      uVar12 = uVar12 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    uVar12 = uVar8 & 0xffffffff;
LAB_001051f3:
    iVar10 = (int)uVar12;
    if (iVar10 != 0) {
      iVar7 = ((int)uVar8 - iVar10) + 1;
      uVar11 = 0xffffffffffffffff;
      if (-1 < iVar7) {
        uVar11 = uVar9 + (long)iVar10 * -4;
      }
      __dest = (int *)operator_new__(uVar11);
      if (0 < iVar7) {
        memcpy(__dest,piVar2 + (uVar12 & 0xffffffff),(ulong)(uint)((int)uVar8 - iVar10) * 4 + 4);
      }
      operator_delete__(piVar2);
      this->vector_ = __dest;
      this->L = this->L - iVar10;
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

Vector::Vector(const std::string& filename, int N) {
    filename_ = filename;
    std::ofstream fil;
    fil.open(filename_.c_str(), std::ios_base::out | std::ios::trunc);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + filename_ + "!\n");
    }
    fil.close();
    if (N>=0){
        this->znak=1;
    }else{
        this->znak=-1;
    }
    N=std::abs(N);
    int tempy=1;
    for (int i=1;;i++){
        tempy*=10;
        if (tempy>N){
            this->L=i;
            break;
        }
    }
    this->vector_=new int[L];
    for(int i=L-1;i>=0;i--){
        this->vector_[i]=N%10;
        N=N/10;
    }
    int j=0;
    for (int i=0; i<L-1; i++){
        if (vector_[i]>0){
            break;
        }else{
            j+=1;
        }
    }
    if (j>0){
        int* vtemp;
        vtemp=new int[L-j];
        for (int i=0;i<L-j;i++){
            vtemp[i]=vector_[i+j];
        }
        delete [] vector_;
        this->vector_=vtemp;
        L=L-j;
    }
  }